

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagnostic.cpp
# Opt level: O2

spv_result_t spvDiagnosticPrint(spv_diagnostic diagnostic)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  
  if (diagnostic != (spv_diagnostic)0x0) {
    bVar1 = diagnostic->isTextSource;
    poVar3 = (ostream *)&std::cerr;
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: ");
    if (bVar1 == true) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar3 = std::operator<<(poVar2,": ");
    }
    else if ((diagnostic->position).index != 0) {
      poVar3 = (ostream *)&std::cerr;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::operator<<(poVar2,": ");
    }
    poVar2 = std::operator<<(poVar3,diagnostic->error);
    std::operator<<(poVar2,"\n");
    return SPV_SUCCESS;
  }
  return SPV_ERROR_INVALID_DIAGNOSTIC;
}

Assistant:

spv_result_t spvDiagnosticPrint(const spv_diagnostic diagnostic) {
  if (!diagnostic) return SPV_ERROR_INVALID_DIAGNOSTIC;

  if (diagnostic->isTextSource) {
    // NOTE: This is a text position
    // NOTE: add 1 to the line as editors start at line 1, we are counting new
    // line characters to start at line 0
    std::cerr << "error: " << diagnostic->position.line + 1 << ": "
              << diagnostic->position.column + 1 << ": " << diagnostic->error
              << "\n";
    return SPV_SUCCESS;
  }

  // NOTE: Assume this is a binary position
  std::cerr << "error: ";
  if (diagnostic->position.index > 0)
    std::cerr << diagnostic->position.index << ": ";
  std::cerr << diagnostic->error << "\n";
  return SPV_SUCCESS;
}